

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::MethodOptions::_InternalSerialize
          (MethodOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  FeatureSet *value;
  bool bVar1;
  MethodOptions_IdempotencyLevel value_00;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint8_t *puVar5;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  const_reference this_01;
  MethodOptions *extendee;
  UnknownFieldSet *unknown_fields;
  UninterpretedOption *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  MethodOptions *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MethodOptions *this_local;
  
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar3 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar3 & 2) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    bVar1 = _internal_deprecated(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x21,bVar1,puVar5);
  }
  if ((uVar3 & 4) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_idempotency_level(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(0x22,value_00,puVar5);
  }
  if ((uVar3 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    iVar2 = FeatureSet::GetCachedSize((this->field_0)._impl_.features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x23,(MessageLite *)value,iVar2,(uint8_t *)stream_local,stream);
  }
  local_30 = 0;
  uVar3 = _internal_uninterpreted_option_size(this);
  for (; local_30 < uVar3; local_30 = local_30 + 1) {
    this_00 = _internal_uninterpreted_option(this);
    this_01 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Get(this_00,local_30);
    iVar2 = UninterpretedOption::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (999,(MessageLite *)this_01,iVar2,(uint8_t *)stream_local,stream);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MethodOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MethodOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        33, this_._internal_deprecated(), target);
  }

  // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        34, this_._internal_idempotency_level(), target);
  }

  // optional .google.protobuf.FeatureSet features = 35;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        35, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodOptions)
  return target;
}